

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::SetLayerZreferenceCentered(ChElementShellReissner4 *this)

{
  double dVar1;
  pointer pdVar2;
  iterator iVar3;
  double *pdVar4;
  pointer pLVar5;
  long lVar6;
  ulong uVar7;
  double local_38;
  
  this->tot_thickness = 0.0;
  pLVar5 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5;
  if (lVar6 != 0) {
    dVar1 = this->tot_thickness;
    lVar6 = (lVar6 >> 3) * -0x3333333333333333;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    pdVar4 = &pLVar5->m_thickness;
    do {
      dVar1 = dVar1 + *pdVar4;
      pdVar4 = pdVar4 + 5;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    this->tot_thickness = dVar1;
  }
  pdVar2 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_38 = this->tot_thickness * -0.5;
  iVar3._M_current =
       (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_layers_z,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pLVar5 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_layers).
      super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar5) {
    lVar6 = 3;
    uVar7 = 0;
    do {
      local_38 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7] + (double)(&pLVar5->m_element)[lVar6];
      iVar3._M_current =
           (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->m_layers_z,iVar3,&local_38);
      }
      else {
        *iVar3._M_current = local_38;
        (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar7 = uVar7 + 1;
      pLVar5 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 5;
    } while (uVar7 < (ulong)(((long)(this->m_layers).
                                    super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5 >> 3)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void ChElementShellReissner4::SetLayerZreferenceCentered() {
    // accumulate element thickness.
    tot_thickness = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        tot_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the z levels of layers, by centering them
    m_layers_z.clear();
    m_layers_z.push_back(-0.5 * this->GetThickness());
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers_z.push_back(m_layers_z[kl] + m_layers[kl].Get_thickness());
    }
}